

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::CloseOuters(SQVM *this,SQObjectPtr *stackindex)

{
  SQUnsignedInteger *pSVar1;
  SQOuter *pSVar2;
  
  while ((pSVar2 = this->_openouters, pSVar2 != (SQOuter *)0x0 && (stackindex <= pSVar2->_valptr)))
  {
    SQObjectPtr::operator=(&pSVar2->_value,pSVar2->_valptr);
    pSVar2->_valptr = &pSVar2->_value;
    this->_openouters = pSVar2->_next;
    pSVar1 = &(pSVar2->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar2->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])(pSVar2);
    }
  }
  return;
}

Assistant:

void SQVM::CloseOuters(SQObjectPtr *stackindex) {
  SQOuter *p;
  while ((p = _openouters) != NULL && p->_valptr >= stackindex) {
    p->_value = *(p->_valptr);
    p->_valptr = &p->_value;
    _openouters = p->_next;
    __ObjRelease(p);
  }
}